

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

cmMakefile * cmakemainGetMakefile(void *clientdata)

{
  if (((clientdata != (void *)0x0) && (*(char *)((long)clientdata + 200) == '\x01')) &&
     (*(long *)((long)clientdata + 0x30) != 0)) {
    return *(cmMakefile **)(*(long *)((long)clientdata + 0x30) + 0xa8);
  }
  return (cmMakefile *)0x0;
}

Assistant:

static cmMakefile* cmakemainGetMakefile(void* clientdata)
{
  cmake* cm = (cmake*)clientdata;
  if (cm && cm->GetDebugOutput()) {
    cmGlobalGenerator* gg = cm->GetGlobalGenerator();
    if (gg) {
      return gg->GetCurrentMakefile();
    }
  }
  return CM_NULLPTR;
}